

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CoverpointSyntax *pCVar1;
  Token TVar2;
  Token TVar3;
  CoverageIffClauseSyntax **unaff_retaddr;
  Token *in_stack_00000008;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_00000010;
  Token *in_stack_00000018;
  Token *in_stack_00000020;
  BumpAllocator *in_stack_00000078;
  Token *in_stack_00000080;
  BumpAllocator *in_stack_ffffffffffffff28;
  CoverageIffClauseSyntax *in_stack_ffffffffffffff30;
  CoverageIffClauseSyntax *local_a0;
  NamedLabelSyntax *local_90;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>
            ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
             in_stack_ffffffffffffffd8);
  not_null<slang::syntax::DataTypeSyntax_*>::operator*
            ((not_null<slang::syntax::DataTypeSyntax_*> *)0xa53dc6);
  deepClone<slang::syntax::DataTypeSyntax>
            ((DataTypeSyntax *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (*(long *)(__fn + 0x58) == 0) {
    local_90 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_90 = deepClone<slang::syntax::NamedLabelSyntax>
                         ((NamedLabelSyntax *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  TVar2 = parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa53e5a);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (*(long *)(__fn + 0x78) == 0) {
    local_a0 = (CoverageIffClauseSyntax *)0x0;
  }
  else {
    local_a0 = deepClone<slang::syntax::CoverageIffClauseSyntax>
                         (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  TVar3 = parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  deepClone<slang::syntax::MemberSyntax>
            ((SyntaxList<slang::syntax::MemberSyntax> *)__child_stack,(BumpAllocator *)local_90);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  parsing::Token::deepClone(in_stack_00000080,in_stack_00000078);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CoverpointSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::DataTypeSyntax&,slang::syntax::NamedLabelSyntax*,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)local_90,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,TVar2._0_8_,
                      (NamedLabelSyntax **)local_a0,(Token *)TVar3.info,TVar3._0_8_,unaff_retaddr,
                      in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CoverpointSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CoverpointSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        node.label ? deepClone(*node.label, alloc) : nullptr,
        node.coverpoint.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.iff ? deepClone(*node.iff, alloc) : nullptr,
        node.openBrace.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.closeBrace.deepClone(alloc),
        node.emptySemi.deepClone(alloc)
    );
}